

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPolarDecomposition.cpp
# Opt level: O1

double chrono::fea::PolarDecomposition::Compute(double *M,double *Q,double *S,double tolerance)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int i_1;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  int i;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  int k;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 extraout_var [56];
  double norm_2;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double norm;
  undefined1 auVar67 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar68 [64];
  undefined1 in_ZMM17 [64];
  double Mk [9];
  double MadjTk [9];
  double Ek [9];
  ulong auStack_158 [2];
  double local_148 [9];
  ulong uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  ulong local_d0;
  ulong local_c8;
  double local_c0 [4];
  ulong local_a0 [7];
  double adStack_68 [3];
  ulong auStack_50 [6];
  
  pdVar4 = local_148;
  pdVar5 = local_148;
  pdVar6 = local_148;
  local_c0[0] = tolerance;
  lVar7 = 0;
  pdVar8 = M;
  do {
    lVar10 = 0;
    pdVar9 = pdVar8;
    do {
      *(double *)((long)pdVar4 + lVar10 * 8) = *pdVar9;
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar10 != 3);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 1;
    pdVar4 = (double *)((long)pdVar4 + 0x18);
  } while (lVar7 != 3);
  auVar67 = ZEXT864(0) << 0x40;
  lVar7 = 0;
  local_f8._8_8_ = 0x7fffffffffffffff;
  local_f8._0_8_ = 0x7fffffffffffffff;
  do {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_148[lVar7];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_148[lVar7 + 3];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_148[lVar7 + 6];
    auVar12 = vandpd_avx(local_f8,auVar12);
    auVar15 = vandpd_avx(local_f8,auVar15);
    auVar14 = vandpd_avx(local_f8,auVar14);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar12._0_8_ + auVar15._0_8_ + auVar14._0_8_;
    auVar12 = vmaxsd_avx(auVar13,auVar67._0_16_);
    auVar67 = ZEXT1664(auVar12);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  auVar12 = vxorpd_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar68 = ZEXT1664(auVar12);
  lVar7 = 0x10;
  do {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)((long)auStack_158 + lVar7);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)((long)local_148 + lVar7 + -8);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)((long)local_148 + lVar7);
    auVar12 = vandpd_avx(local_f8,auVar17);
    auVar15 = vandpd_avx(local_f8,auVar29);
    auVar14 = vandpd_avx(local_f8,auVar42);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar12._0_8_ + auVar15._0_8_ + auVar14._0_8_;
    auVar12 = vmaxsd_avx512f(auVar18,auVar68._0_16_);
    auVar68 = ZEXT1664(auVar12);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x58);
  do {
    auVar17 = in_ZMM17._0_16_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_148[4];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_148[8];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_148[5];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_148[7];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_148[7] * local_148[5];
    auVar12 = vfmsub231sd_fma(auVar55,auVar19,auVar30);
    local_c0[1] = (double)auVar12._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_148[6];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_148[3];
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_148[8] * local_148[3];
    auVar15 = vfmsub231sd_fma(auVar60,auVar43,auVar57);
    local_c0[2] = auVar15._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_148[6] * local_148[4];
    auVar14 = vfmsub231sd_fma(auVar61,auVar59,auVar51);
    local_c0[3] = (double)auVar14._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_148[2];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_148[0];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_148[1];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_148[1] * local_148[8];
    auVar13 = vfmsub231sd_fma(auVar65,auVar51,auVar62);
    local_a0[0] = auVar13._0_8_;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_148[2] * local_148[6];
    auVar13 = vfmsub231sd_fma(auVar66,auVar63,auVar30);
    local_a0[1] = auVar13._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_148[0] * local_148[7];
    auVar13 = vfmsub231sd_fma(auVar31,auVar64,auVar57);
    local_a0[2] = auVar13._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_148[2] * local_148[4];
    auVar13 = vfmsub231sd_fma(auVar32,auVar64,auVar43);
    local_a0[3] = auVar13._0_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_148[0] * local_148[5];
    auVar13 = vfmsub231sd_fma(auVar33,auVar62,auVar59);
    local_a0[4] = auVar13._0_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_148[1] * local_148[3];
    auVar13 = vfmsub231sd_fma(auVar34,auVar63,auVar19);
    local_a0[5] = auVar13._0_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_148[1] * auVar15._0_8_;
    auVar12 = vfmadd231sd_fma(auVar58,auVar63,auVar12);
    local_e8 = vfmadd231sd_fma(auVar12,auVar62,auVar14);
    auVar12 = auVar68._0_16_;
    if ((local_e8._0_8_ != 0.0) || (NAN(local_e8._0_8_))) {
      auVar15 = ZEXT816(0);
      lVar7 = -0x18;
      do {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)((long)local_a0 + lVar7);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)local_a0 + lVar7 + 0x18);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)((long)local_a0 + lVar7 + 0x30);
        auVar14 = vandpd_avx(local_f8,auVar35);
        auVar13 = vandpd_avx(local_f8,auVar44);
        auVar18 = vandpd_avx(local_f8,auVar52);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auVar14._0_8_ + auVar13._0_8_ + auVar18._0_8_;
        auVar15 = vmaxsd_avx(auVar36,auVar15);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0);
      auVar14 = ZEXT816(0);
      lVar7 = 0x10;
      do {
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)&local_c8 + lVar7);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)((long)local_c0 + lVar7);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)((long)local_c0 + lVar7 + 8);
        auVar13 = vandpd_avx(local_f8,auVar45);
        auVar18 = vandpd_avx(local_f8,auVar53);
        auVar29 = vandpd_avx(local_f8,auVar56);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = auVar13._0_8_ + auVar18._0_8_ + auVar29._0_8_;
        auVar14 = vmaxsd_avx(auVar46,auVar14);
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x58);
      auVar13 = vmulsd_avx512f(auVar12,auVar67._0_16_);
      auVar20._0_8_ = (auVar15._0_8_ * auVar14._0_8_) / auVar13._0_8_;
      auVar20._8_8_ = 0;
      if (auVar20._0_8_ < 0.0) {
        auStack_158[1] = 0x62a7a4;
        auVar67._0_8_ = sqrt(auVar20._0_8_);
        auVar67._8_56_ = extraout_var;
        auVar15 = auVar67._0_16_;
      }
      else {
        auVar15 = vsqrtsd_avx(auVar20,auVar20);
      }
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar14 = vandpd_avx512vl(local_e8,auVar3);
      auVar21._0_8_ = auVar15._0_8_ / auVar14._0_8_;
      auVar21._8_8_ = auVar15._8_8_;
      if (auVar21._0_8_ < 0.0) {
        auStack_158[1] = 0x62a7cf;
        dVar16 = sqrt(auVar21._0_8_);
      }
      else {
        auVar15 = vsqrtsd_avx(auVar21,auVar21);
        dVar16 = auVar15._0_8_;
      }
      lVar7 = 0;
      do {
        dVar1 = local_148[lVar7];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar16 * 0.5;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = (0.5 / ((double)local_e8._0_8_ * dVar16)) * local_c0[lVar7 + 1];
        auVar15 = vfmadd231sd_fma(auVar54,auVar37,auVar47);
        local_148[lVar7] = auVar15._0_8_;
        adStack_68[lVar7] = dVar1 - auVar15._0_8_;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 9);
      auVar15 = vxorpd_avx512vl(auVar17,auVar17);
      lVar7 = -0x18;
      do {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)((long)auStack_50 + lVar7);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)auStack_50 + lVar7 + 0x18);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(&stack0xffffffffffffffe0 + lVar7);
        auVar14 = vandpd_avx(local_f8,auVar22);
        auVar13 = vandpd_avx(local_f8,auVar38);
        auVar17 = vandpd_avx(local_f8,auVar48);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auVar14._0_8_ + auVar13._0_8_ + auVar17._0_8_;
        auVar15 = vmaxsd_avx512f(auVar23,auVar15);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0);
      auVar67 = ZEXT864(0) << 0x40;
      lVar7 = -0x18;
      do {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)((long)local_148 + lVar7 + 0x18);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)local_148 + lVar7 + 0x30);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)&uStack_100 + lVar7);
        auVar15 = vandpd_avx(local_f8,auVar24);
        auVar14 = vandpd_avx(local_f8,auVar39);
        auVar13 = vandpd_avx(local_f8,auVar49);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = auVar15._0_8_ + auVar14._0_8_ + auVar13._0_8_;
        auVar15 = vmaxsd_avx(auVar25,auVar67._0_16_);
        auVar67 = ZEXT1664(auVar15);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0);
      auVar12 = vxorpd_avx512vl(auVar12,auVar12);
      auVar68 = ZEXT1664(auVar12);
      lVar7 = 0x10;
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)((long)auStack_158 + lVar7);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)local_148 + lVar7 + -8);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)((long)local_148 + lVar7);
        auVar12 = vandpd_avx(local_f8,auVar26);
        auVar15 = vandpd_avx(local_f8,auVar40);
        auVar14 = vandpd_avx(local_f8,auVar50);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar12._0_8_ + auVar15._0_8_ + auVar14._0_8_;
        auVar12 = vmaxsd_avx512f(auVar27,auVar68._0_16_);
        auVar68 = ZEXT1664(auVar12);
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x58);
    }
    else {
      local_c8 = auVar67._0_8_;
      vmovsd_avx512f(auVar12);
      vmovsd_avx512f(auVar17);
      auStack_158[1] = 0x62a770;
      puts("Warning (polarDecomposition) : zero determinant encountered.");
      auVar68 = ZEXT864(local_d0);
      auVar67 = ZEXT864(local_c8);
    }
    if (((double)local_e8._0_8_ == 0.0) && (!NAN((double)local_e8._0_8_))) break;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar67._0_8_ * local_c0[0];
    auVar12 = vucomisd_avx512f(auVar28);
    in_ZMM17 = ZEXT1664(auVar12);
  } while (0.0 < (double)local_e8._0_8_);
  lVar7 = 0;
  do {
    lVar10 = 0;
    pdVar8 = pdVar5;
    do {
      Q[lVar10] = *pdVar8;
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar10 != 3);
    lVar7 = lVar7 + 1;
    Q = Q + 3;
    pdVar5 = pdVar5 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    lVar10 = 0;
    pdVar8 = M;
    do {
      S[lVar7 * 3 + lVar10] = 0.0;
      auVar67 = ZEXT864(0) << 0x40;
      lVar11 = 0;
      pdVar4 = pdVar8;
      do {
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)pdVar6 + lVar11 * 8);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pdVar4;
        auVar12 = vfmadd231sd_fma(auVar67._0_16_,auVar41,auVar2);
        auVar67 = ZEXT1664(auVar12);
        S[lVar7 * 3 + lVar10] = auVar12._0_8_;
        lVar11 = lVar11 + 1;
        pdVar4 = pdVar4 + 3;
      } while (lVar11 != 3);
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar10 != 3);
    lVar7 = lVar7 + 1;
    pdVar6 = (double *)((long)pdVar6 + 0x18);
  } while (lVar7 != 3);
  lVar7 = 0x48;
  lVar10 = 0;
  do {
    lVar11 = 0;
    pdVar8 = S;
    do {
      dVar16 = (*pdVar8 + *(double *)((long)S + lVar11)) * 0.5;
      *(double *)((long)S + lVar11) = dVar16;
      *pdVar8 = dVar16;
      pdVar8 = pdVar8 + 1;
      lVar11 = lVar11 + 0x18;
    } while (lVar7 != lVar11);
    lVar10 = lVar10 + 1;
    S = S + 4;
    lVar7 = lVar7 + -0x18;
  } while (lVar10 != 3);
  return (double)local_e8._0_8_;
}

Assistant:

double PolarDecomposition::Compute(const double* M, double* Q, double* S, double tolerance) {
    double Mk[9];
    double Ek[9];
    double det, M_oneNorm, M_infNorm, E_oneNorm;

    // Mk = M^T
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            Mk[3 * i + j] = M[3 * j + i];

    M_oneNorm = oneNorm(Mk);
    M_infNorm = infNorm(Mk);

    do {
        double MadjTk[9];

        // row 2 x row 3
        crossProduct(&(Mk[3]), &(Mk[6]), &(MadjTk[0]));
        // row 3 x row 1
        crossProduct(&(Mk[6]), &(Mk[0]), &(MadjTk[3]));
        // row 1 x row 2
        crossProduct(&(Mk[0]), &(Mk[3]), &(MadjTk[6]));

        det = Mk[0] * MadjTk[0] + Mk[1] * MadjTk[1] + Mk[2] * MadjTk[2];
        if (det == 0.0) {
            printf("Warning (polarDecomposition) : zero determinant encountered.\n");
            break;
        }

        double MadjT_one = oneNorm(MadjTk);
        double MadjT_inf = infNorm(MadjTk);

        double gamma = sqrt(sqrt((MadjT_one * MadjT_inf) / (M_oneNorm * M_infNorm)) / fabs(det));
        double g1 = gamma * 0.5;
        double g2 = 0.5 / (gamma * det);

        for (int i = 0; i < 9; i++) {
            Ek[i] = Mk[i];
            Mk[i] = g1 * Mk[i] + g2 * MadjTk[i];
            Ek[i] -= Mk[i];
        }

        E_oneNorm = oneNorm(Ek);
        M_oneNorm = oneNorm(Mk);
        M_infNorm = infNorm(Mk);
    } while (E_oneNorm > M_oneNorm * tolerance);

    // Q = Mk^T
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            Q[3 * i + j] = Mk[3 * j + i];

    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++) {
            S[3 * i + j] = 0;
            for (int k = 0; k < 3; k++)
                S[3 * i + j] += Mk[3 * i + k] * M[3 * k + j];
        }

    // S must be symmetric; enforce the symmetry
    for (int i = 0; i < 3; i++)
        for (int j = i; j < 3; j++)
            S[3 * i + j] = S[3 * j + i] = 0.5 * (S[3 * i + j] + S[3 * j + i]);

    return (det);
}